

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers_test.cpp
# Opt level: O0

void __thiscall Sampler_ConsistentValues_Test::TestBody(Sampler_ConsistentValues_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  ulong uVar6;
  size_type sVar7;
  Point2f PVar8;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  int s_1;
  int i;
  int s;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> s2d [16];
  vector<float,_std::allocator<float>_> s1d [16];
  SamplerHandle *sampler;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__range1;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> samplers;
  Point2i resolution;
  int spp;
  int rootSpp;
  RandomizeStrategy in_stack_fffffffffffff9e8;
  RandomizeStrategy in_stack_fffffffffffff9ec;
  int in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffff9f4;
  int in_stack_fffffffffffff9f8;
  int in_stack_fffffffffffff9fc;
  Allocator in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  undefined4 in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa14;
  undefined4 in_stack_fffffffffffffa18;
  Type in_stack_fffffffffffffa1c;
  Allocator in_stack_fffffffffffffa20;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffa30;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffa38;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffa40;
  vector<float,_std::allocator<float>_> *local_5b8;
  undefined4 in_stack_fffffffffffffa68;
  Float in_stack_fffffffffffffa6c;
  AssertHelper *in_stack_fffffffffffffa70;
  vector<float,_std::allocator<float>_> *local_4f0;
  vector<float,_std::allocator<float>_> *local_4d8;
  AssertionResult local_458 [2];
  undefined8 local_438;
  AssertionResult local_430;
  int local_41c;
  int local_410;
  undefined8 local_40c;
  undefined8 local_404;
  Float local_3f4;
  undefined8 local_3f0;
  int local_3e8;
  int local_3dc;
  vector<float,_std::allocator<float>_> local_3d8 [16];
  vector<float,_std::allocator<float>_> local_258 [16];
  vector<float,_std::allocator<float>_> vStack_d8;
  __normal_iterator<pbrt::SamplerHandle_*,_std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>_>
  local_c0;
  undefined1 *local_b8;
  undefined1 local_30 [32];
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 4;
  local_10 = 0x10;
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)0x554f89);
  operator_new(0x48);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  pbrt::HaltonSampler::HaltonSampler
            ((HaltonSampler *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             in_stack_fffffffffffffa14,
             (Point2i *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
              *)in_stack_fffffffffffffa00.memoryResource,in_stack_fffffffffffffa20);
  pbrt::SamplerHandle::TaggedPointer<pbrt::HaltonSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (HaltonSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x18);
  pbrt::RandomSampler::RandomSampler
            ((RandomSampler *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8);
  pbrt::SamplerHandle::TaggedPointer<pbrt::RandomSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (RandomSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler
            ((PaddedSobolSampler *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8);
  pbrt::SamplerHandle::TaggedPointer<pbrt::PaddedSobolSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (PaddedSobolSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler
            ((PaddedSobolSampler *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8);
  pbrt::SamplerHandle::TaggedPointer<pbrt::PaddedSobolSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (PaddedSobolSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler
            ((PaddedSobolSampler *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8);
  pbrt::SamplerHandle::TaggedPointer<pbrt::PaddedSobolSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (PaddedSobolSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x18);
  pbrt::PaddedSobolSampler::PaddedSobolSampler
            ((PaddedSobolSampler *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8);
  pbrt::SamplerHandle::TaggedPointer<pbrt::PaddedSobolSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (PaddedSobolSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x20);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  pbrt::PMJ02BNSampler::PMJ02BNSampler
            ((PMJ02BNSampler *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
             in_stack_fffffffffffff9f4,in_stack_fffffffffffffa00);
  pbrt::SamplerHandle::TaggedPointer<pbrt::PMJ02BNSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (PMJ02BNSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x30);
  pbrt::StratifiedSampler::StratifiedSampler
            ((StratifiedSampler *)in_stack_fffffffffffffa00.memoryResource,in_stack_fffffffffffff9fc
             ,in_stack_fffffffffffff9f8,SUB41((uint)in_stack_fffffffffffff9f4 >> 0x18,0),
             in_stack_fffffffffffff9f0);
  pbrt::SamplerHandle::TaggedPointer<pbrt::StratifiedSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (StratifiedSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x20);
  pbrt::SobolSampler::SobolSampler
            ((SobolSampler *)in_stack_fffffffffffffa00.memoryResource,in_stack_fffffffffffff9fc,
             (Point2i *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9ec);
  pbrt::SamplerHandle::TaggedPointer<pbrt::SobolSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (SobolSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x20);
  pbrt::SobolSampler::SobolSampler
            ((SobolSampler *)in_stack_fffffffffffffa00.memoryResource,in_stack_fffffffffffff9fc,
             (Point2i *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9ec);
  pbrt::SamplerHandle::TaggedPointer<pbrt::SobolSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (SobolSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x20);
  pbrt::SobolSampler::SobolSampler
            ((SobolSampler *)in_stack_fffffffffffffa00.memoryResource,in_stack_fffffffffffff9fc,
             (Point2i *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9ec);
  pbrt::SamplerHandle::TaggedPointer<pbrt::SobolSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (SobolSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  operator_new(0x20);
  pbrt::SobolSampler::SobolSampler
            ((SobolSampler *)in_stack_fffffffffffffa00.memoryResource,in_stack_fffffffffffff9fc,
             (Point2i *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             in_stack_fffffffffffff9ec);
  pbrt::SamplerHandle::TaggedPointer<pbrt::SobolSampler>
            ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (SobolSampler *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::push_back
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
             (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  local_b8 = local_30;
  local_c0._M_current =
       (SamplerHandle *)
       std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::begin
                 ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
                  CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  vStack_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::end
                          ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
                           CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<pbrt::SamplerHandle_*,_std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>_>
                             *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                            (__normal_iterator<pbrt::SamplerHandle_*,_std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>_>
                             *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)), bVar5
        ) {
    vStack_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)__gnu_cxx::
                         __normal_iterator<pbrt::SamplerHandle_*,_std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>_>
                         ::operator*(&local_c0);
    local_4d8 = local_258;
    do {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x5554b9);
      local_4d8 = local_4d8 + 1;
    } while (local_4d8 != &vStack_d8);
    local_4f0 = local_3d8;
    do {
      std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
                ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x555511);
      local_4f0 = local_4f0 + 1;
    } while (local_4f0 != local_258);
    for (local_3dc = 0; local_3dc < 0x10; local_3dc = local_3dc + 1) {
      pbrt::Point2<int>::Point2
                ((Point2<int> *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8);
      pbrt::SamplerHandle::StartPixelSample
                ((SamplerHandle *)in_stack_fffffffffffffa40,(Point2i *)in_stack_fffffffffffffa38,
                 (int)((ulong)in_stack_fffffffffffffa30 >> 0x20),(int)in_stack_fffffffffffffa30);
      for (local_3e8 = 0; local_3e8 < 10; local_3e8 = local_3e8 + 1) {
        PVar8 = pbrt::SamplerHandle::Get2D
                          ((SamplerHandle *)
                           CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        auVar4._8_8_ = extraout_XMM0_Qb;
        auVar4._0_4_ = PVar8.super_Tuple2<pbrt::Point2,_float>.x;
        auVar4._4_4_ = PVar8.super_Tuple2<pbrt::Point2,_float>.y;
        local_3f0 = vmovlpd_avx(auVar4);
        std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::push_back
                  ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                   CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                   (value_type *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        local_3f4 = pbrt::SamplerHandle::Get1D
                              ((SamplerHandle *)
                               CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
      }
    }
    pbrt::Point2<int>::Point2
              ((Point2<int> *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8);
    pbrt::SamplerHandle::StartPixelSample
              ((SamplerHandle *)in_stack_fffffffffffffa40,(Point2i *)in_stack_fffffffffffffa38,
               (int)((ulong)in_stack_fffffffffffffa30 >> 0x20),(int)in_stack_fffffffffffffa30);
    PVar8 = pbrt::SamplerHandle::Get2D
                      ((SamplerHandle *)
                       CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    auVar3._8_8_ = extraout_XMM0_Qb_00;
    auVar3._0_4_ = PVar8.super_Tuple2<pbrt::Point2,_float>.x;
    auVar3._4_4_ = PVar8.super_Tuple2<pbrt::Point2,_float>.y;
    local_404 = vmovlpd_avx(auVar3);
    PVar8 = pbrt::SamplerHandle::Get2D
                      ((SamplerHandle *)
                       CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    auVar2._8_8_ = extraout_XMM0_Qb_01;
    auVar2._0_4_ = PVar8.super_Tuple2<pbrt::Point2,_float>.x;
    auVar2._4_4_ = PVar8.super_Tuple2<pbrt::Point2,_float>.y;
    local_40c = vmovlpd_avx(auVar2);
    pbrt::SamplerHandle::Get1D
              ((SamplerHandle *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
    for (local_410 = 0xf; -1 < local_410; local_410 = local_410 + -1) {
      pbrt::Point2<int>::Point2
                ((Point2<int> *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8);
      pbrt::SamplerHandle::StartPixelSample
                ((SamplerHandle *)in_stack_fffffffffffffa40,(Point2i *)in_stack_fffffffffffffa38,
                 (int)((ulong)in_stack_fffffffffffffa30 >> 0x20),(int)in_stack_fffffffffffffa30);
      for (local_41c = 0; uVar6 = (ulong)local_41c,
          sVar7 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::size
                            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                             (local_3d8 + local_410)), uVar6 < sVar7; local_41c = local_41c + 1) {
        std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::operator[]
                  ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                   (local_3d8 + local_410),(long)local_41c);
        PVar8 = pbrt::SamplerHandle::Get2D
                          ((SamplerHandle *)
                           CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
        auVar1._8_8_ = extraout_XMM0_Qb_02;
        auVar1._0_4_ = PVar8.super_Tuple2<pbrt::Point2,_float>.x;
        auVar1._4_4_ = PVar8.super_Tuple2<pbrt::Point2,_float>.y;
        local_438 = vmovlpd_avx(auVar1);
        testing::internal::EqHelper<false>::Compare<pbrt::Point2<float>,pbrt::Point2<float>>
                  ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                   (char *)in_stack_fffffffffffffa00.memoryResource,
                   (Point2<float> *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (Point2<float> *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
        bVar5 = testing::AssertionResult::operator_cast_to_bool(&local_430);
        if (!bVar5) {
          testing::Message::Message((Message *)in_stack_fffffffffffffa20.memoryResource);
          in_stack_fffffffffffffa70 =
               (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x555afe);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffa20.memoryResource,
                     in_stack_fffffffffffffa1c,
                     (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                     in_stack_fffffffffffffa0c,(char *)in_stack_fffffffffffffa00.memoryResource);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffa70,
                     (Message *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
          testing::Message::~Message((Message *)0x555b61);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x555bb9);
        std::vector<float,_std::allocator<float>_>::operator[]
                  (local_258 + local_410,(long)local_41c);
        in_stack_fffffffffffffa6c =
             pbrt::SamplerHandle::Get1D
                       ((SamplerHandle *)
                        CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
        testing::internal::EqHelper<false>::Compare<float,float>
                  ((char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                   (char *)in_stack_fffffffffffffa00.memoryResource,
                   (float *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (float *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
        bVar5 = testing::AssertionResult::operator_cast_to_bool(local_458);
        if (!bVar5) {
          testing::Message::Message((Message *)in_stack_fffffffffffffa20.memoryResource);
          testing::AssertionResult::failure_message((AssertionResult *)0x555c9c);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffa20.memoryResource,
                     in_stack_fffffffffffffa1c,
                     (char *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
                     in_stack_fffffffffffffa0c,(char *)in_stack_fffffffffffffa00.memoryResource);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffa70,
                     (Message *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
          testing::Message::~Message((Message *)0x555cf9);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x555d4e);
      }
    }
    in_stack_fffffffffffffa40 = local_3d8;
    local_5b8 = local_258;
    do {
      in_stack_fffffffffffffa38 = local_5b8 + -1;
      std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~vector
                ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                 in_stack_fffffffffffffa00.memoryResource);
      local_5b8 = in_stack_fffffffffffffa38;
    } while (in_stack_fffffffffffffa38 != in_stack_fffffffffffffa40);
    in_stack_fffffffffffffa20.memoryResource = (memory_resource *)&vStack_d8;
    do {
      in_stack_fffffffffffffa20.memoryResource =
           (memory_resource *)((long)in_stack_fffffffffffffa20.memoryResource + -0x18);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffa00.memoryResource);
    } while ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffa20.memoryResource !=
             local_258);
    in_stack_fffffffffffffa30 =
         (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffa20.memoryResource;
    __gnu_cxx::
    __normal_iterator<pbrt::SamplerHandle_*,_std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>_>
    ::operator++(&local_c0);
  }
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::~vector
            ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)
             in_stack_fffffffffffffa00.memoryResource);
  return;
}

Assistant:

TEST(Sampler, ConsistentValues) {
    constexpr int rootSpp = 4;
    constexpr int spp = rootSpp * rootSpp;
    Point2i resolution(100, 101);

    std::vector<SamplerHandle> samplers;
    samplers.push_back(new HaltonSampler(spp, resolution));
    samplers.push_back(new RandomSampler(spp));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::None));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::CranleyPatterson));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::Xor));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::Owen));
    samplers.push_back(new PMJ02BNSampler(spp));
    samplers.push_back(new StratifiedSampler(rootSpp, rootSpp, true));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::None));
    samplers.push_back(
        new SobolSampler(spp, resolution, RandomizeStrategy::CranleyPatterson));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::Xor));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::Owen));

    for (auto &sampler : samplers) {
        std::vector<Float> s1d[spp];
        std::vector<Point2f> s2d[spp];

        for (int s = 0; s < spp; ++s) {
            sampler.StartPixelSample({1, 5}, s);
            for (int i = 0; i < 10; ++i) {
                s2d[s].push_back(sampler.Get2D());
                s1d[s].push_back(sampler.Get1D());
            }
        }

        // Go somewhere else and generate some samples, just to make sure
        // things are shaken up.
        sampler.StartPixelSample({0, 6}, 10);
        sampler.Get2D();
        sampler.Get2D();
        sampler.Get1D();

        // Now go back and generate samples again, but enumerate them in a
        // different order to make sure the sampler is doing the right
        // thing.
        for (int s = spp - 1; s >= 0; --s) {
            sampler.StartPixelSample({1, 5}, s);
            for (int i = 0; i < s2d[s].size(); ++i) {
                EXPECT_EQ(s2d[s][i], sampler.Get2D());
                EXPECT_EQ(s1d[s][i], sampler.Get1D());
            }
        }
    }
}